

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

ParserResult * __thiscall
Catch::clara::detail::
BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/alecthomas[P]entityx/entityx/3rdparty/catch.hpp:9738:35)>
::setValue(ParserResult *__return_storage_ptr__,
          BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_alecthomas[P]entityx_entityx_3rdparty_catch_hpp:9738:35)>
          *this,string *arg)

{
  long lVar1;
  _Alloc_hider __s1;
  size_type __n;
  int iVar2;
  InWhatOrder IVar3;
  long *plVar4;
  long *plVar5;
  long *plVar6;
  size_t __len;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> temp;
  long local_b8;
  uint uStack_b0;
  undefined4 uStack_ac;
  BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_alecthomas[P]entityx_entityx_3rdparty_catch_hpp:9738:35)>
  *local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined **local_60;
  undefined8 local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  local_a0._M_string_length = 0;
  local_a0.field_2._M_local_buf[0] = '\0';
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  ::std::__cxx11::string::_M_assign((string *)&local_a0);
  __n = local_a0._M_string_length;
  __s1._M_p = local_a0._M_dataplus._M_p;
  local_58 = 0;
  local_60 = &PTR__BasicResult_001bf998;
  local_48 = 0;
  local_40[0] = 0;
  local_b8 = 0x646572616c636564;
  uStack_b0 = uStack_b0 & 0xffffff00;
  local_50 = local_40;
  if (local_a0._M_string_length < 9) {
    local_a8 = this;
    if ((local_a0._M_string_length == 0) ||
       (iVar2 = bcmp(local_a0._M_dataplus._M_p,&local_b8,local_a0._M_string_length), iVar2 == 0)) {
      IVar3 = InDeclarationOrder;
    }
    else {
      local_b8 = 0x6c61636978656c;
      if (__n == 8) goto LAB_00174686;
      iVar2 = bcmp(__s1._M_p,&local_b8,__n);
      if (iVar2 == 0) {
        IVar3 = InLexicographicalOrder;
      }
      else {
        local_b8 = CONCAT17(local_b8._7_1_,0x6d6f646e6172);
        if ((6 < __n) || (iVar2 = bcmp(__s1._M_p,&local_b8,__n), iVar2 != 0)) goto LAB_00174686;
        IVar3 = InRandomOrder;
      }
    }
    ((local_a8->m_lambda).config)->runOrder = IVar3;
    *(undefined8 *)
     &(__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
      super_ResultBase.m_type = 0;
    (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
    super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_001bf998;
    (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
    (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
    (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
  }
  else {
LAB_00174686:
    ::std::operator+(&local_80,"Unrecognised ordering: \'",&local_a0);
    plVar4 = (long *)::std::__cxx11::string::append((char *)&local_80);
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_b8 = *plVar5;
      uStack_b0 = *(uint *)(plVar4 + 3);
      uStack_ac = *(undefined4 *)((long)plVar4 + 0x1c);
      plVar6 = &local_b8;
    }
    else {
      local_b8 = *plVar5;
      plVar6 = (long *)*plVar4;
    }
    lVar1 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
    super_ResultBase.m_type = RuntimeError;
    (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
    super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_001bf998;
    (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_errorMessage,plVar6,lVar1 + (long)plVar6);
    if (plVar6 != &local_b8) {
      operator_delete(plVar6);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    local_60 = &PTR__BasicResult_001bf998;
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

auto setValue( std::string const &arg ) -> ParserResult override {
            return invokeLambda<typename UnaryLambdaTraits<L>::ArgType>( m_lambda, arg );
        }